

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O2

void __thiscall
testing::Matcher<std::basic_string_view<char,_std::char_traits<char>_>_>::Matcher
          (Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *this,char *s)

{
  allocator<char> local_69;
  string local_68 [32];
  string local_48 [32];
  MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_> local_28;
  
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_0014e758;
  std::__cxx11::string::string<std::allocator<char>>(local_68,s,&local_69);
  std::__cxx11::string::string(local_48,local_68);
  internal::ComparisonBase::operator_cast_to_Matcher
            ((Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_28,
             (ComparisonBase *)local_48);
  std::
  __shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&(this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).
               impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
              ,&local_28.impl_.
                super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
             );
  internal::MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>::~MatcherBase
            (&local_28);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

Matcher<internal::StringView>::Matcher(const char* s) {
  *this = Eq(std::string(s));
}